

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

RowSetEntry * rowSetListToTree(RowSetEntry *pList)

{
  RowSetEntry *pRVar1;
  RowSetEntry *pRVar2;
  RowSetEntry *pLeft;
  RowSetEntry *p;
  RowSetEntry *pRStack_10;
  int iDepth;
  RowSetEntry *pList_local;
  
  pRStack_10 = pList->pRight;
  pList->pRight = (RowSetEntry *)0x0;
  pList->pLeft = (RowSetEntry *)0x0;
  p._4_4_ = 1;
  pLeft = pList;
  while (pRVar1 = pRStack_10, pRVar2 = pLeft, pRStack_10 != (RowSetEntry *)0x0) {
    pLeft = pRStack_10;
    pRStack_10->pLeft = pRVar2;
    pRStack_10 = pRStack_10->pRight;
    pRVar2 = rowSetNDeepTree(&stack0xfffffffffffffff0,p._4_4_);
    pRVar1->pRight = pRVar2;
    p._4_4_ = p._4_4_ + 1;
  }
  return pLeft;
}

Assistant:

static struct RowSetEntry *rowSetListToTree(struct RowSetEntry *pList){
  int iDepth;           /* Depth of the tree so far */
  struct RowSetEntry *p;       /* Current tree root */
  struct RowSetEntry *pLeft;   /* Left subtree */

  assert( pList!=0 );
  p = pList;
  pList = p->pRight;
  p->pLeft = p->pRight = 0;
  for(iDepth=1; pList; iDepth++){
    pLeft = p;
    p = pList;
    pList = p->pRight;
    p->pLeft = pLeft;
    p->pRight = rowSetNDeepTree(&pList, iDepth);
  }
  return p;
}